

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oid.cpp
# Opt level: O2

int mbedtls_oid_from_numeric_string(mbedtls_asn1_buf *oid,char *oid_str,size_t size)

{
  char *pcVar1;
  int iVar2;
  long lVar3;
  uchar *puVar4;
  uchar *__dest;
  size_t i;
  size_t sVar5;
  char *bound;
  size_t __nmemb;
  char *str_ptr;
  uint val;
  uchar *out_ptr;
  uint component2;
  uint component1;
  char *local_38;
  
  val = 0;
  lVar3 = 0;
  for (sVar5 = 0; size != sVar5; sVar5 = sVar5 + 1) {
    lVar3 = lVar3 + (ulong)(oid_str[sVar5] == '.');
  }
  if (lVar3 - 0x80U < 0xffffffffffffff81) {
    return -0x68;
  }
  str_ptr = oid_str;
  puVar4 = (uchar *)calloc(lVar3 * 5,1);
  oid->p = puVar4;
  if (puVar4 == (uchar *)0x0) {
    return -0x6a;
  }
  bound = oid_str + size;
  out_ptr = puVar4;
  iVar2 = oid_parse_number(&component1,&str_ptr,bound);
  if ((((iVar2 == 0) && (iVar2 = -0x68, component1 < 3)) && (str_ptr < bound)) && (*str_ptr == '.'))
  {
    str_ptr = str_ptr + 1;
    iVar2 = oid_parse_number(&component2,&str_ptr,bound);
    if (iVar2 == 0) {
      if (component1 == 2 || component2 < 0x28) {
        iVar2 = -0x68;
        if (str_ptr < bound) {
          if (*str_ptr != '.') goto LAB_003864d3;
          str_ptr = str_ptr + 1;
        }
        local_38 = str_ptr;
        if (!CARRY4(component1 * 0x28,component2)) {
          iVar2 = oid_subidentifier_encode_into
                            (&out_ptr,puVar4 + lVar3 * 5,component1 * 0x28 + component2);
          pcVar1 = local_38;
          while (iVar2 == 0) {
            if (bound <= pcVar1) {
              puVar4 = oid->p;
              __nmemb = (long)out_ptr - (long)puVar4;
              __dest = (uchar *)calloc(__nmemb,1);
              if (__dest != (uchar *)0x0) {
                switchD_0036ecca::default(__dest,puVar4,__nmemb);
                free(puVar4);
                oid->p = __dest;
                oid->len = __nmemb;
                oid->tag = 6;
                return 0;
              }
              iVar2 = -0x6a;
              break;
            }
            iVar2 = oid_parse_number(&val,&str_ptr,bound);
            if (iVar2 != 0) break;
            if (str_ptr < bound) {
              if (*str_ptr != '.') goto LAB_003864a2;
              str_ptr = str_ptr + 1;
            }
            pcVar1 = str_ptr;
            iVar2 = oid_subidentifier_encode_into(&out_ptr,puVar4 + lVar3 * 5,val);
          }
        }
      }
      else {
LAB_003864a2:
        iVar2 = -0x68;
      }
    }
  }
LAB_003864d3:
  free(oid->p);
  oid->len = 0;
  oid->p = (uchar *)0x0;
  return iVar2;
}

Assistant:

int mbedtls_oid_from_numeric_string(mbedtls_asn1_buf *oid,
                                    const char *oid_str, size_t size)
{
    int ret = MBEDTLS_ERR_ASN1_INVALID_DATA;
    const char *str_ptr = oid_str;
    const char *str_bound = oid_str + size;
    unsigned int val = 0;
    unsigned int component1, component2;
    size_t encoded_len;
    unsigned char *resized_mem;

    /* Count the number of dots to get a worst-case allocation size. */
    size_t num_dots = 0;
    for (size_t i = 0; i < size; i++) {
        if (oid_str[i] == '.') {
            num_dots++;
        }
    }
    /* Allocate maximum possible required memory:
     * There are (num_dots + 1) integer components, but the first 2 share the
     * same subidentifier, so we only need num_dots subidentifiers maximum. */
    if (num_dots == 0 || (num_dots > MBEDTLS_OID_MAX_COMPONENTS - 1)) {
        return MBEDTLS_ERR_ASN1_INVALID_DATA;
    }
    /* Each byte can store 7 bits, calculate number of bytes for a
     * subidentifier:
     *
     * bytes = ceil(subidentifer_size * 8 / 7)
     */
    size_t bytes_per_subidentifier = (((sizeof(unsigned int) * 8) - 1) / 7)
                                     + 1;
    size_t max_possible_bytes = num_dots * bytes_per_subidentifier;
    oid->p = (unsigned char*) mbedtls_calloc(max_possible_bytes, 1);
    if (oid->p == NULL) {
        return MBEDTLS_ERR_ASN1_ALLOC_FAILED;
    }
    unsigned char *out_ptr = oid->p;
    unsigned char *out_bound = oid->p + max_possible_bytes;

    ret = oid_parse_number(&component1, &str_ptr, str_bound);
    if (ret != 0) {
        goto error;
    }
    if (component1 > 2) {
        /* First component can't be > 2 */
        ret = MBEDTLS_ERR_ASN1_INVALID_DATA;
        goto error;
    }
    if (str_ptr >= str_bound || *str_ptr != '.') {
        ret = MBEDTLS_ERR_ASN1_INVALID_DATA;
        goto error;
    }
    str_ptr++;

    ret = oid_parse_number(&component2, &str_ptr, str_bound);
    if (ret != 0) {
        goto error;
    }
    if ((component1 < 2) && (component2 > 39)) {
        /* Root nodes 0 and 1 may have up to 40 children, numbered 0-39 */
        ret = MBEDTLS_ERR_ASN1_INVALID_DATA;
        goto error;
    }
    if (str_ptr < str_bound) {
        if (*str_ptr == '.') {
            str_ptr++;
        } else {
            ret = MBEDTLS_ERR_ASN1_INVALID_DATA;
            goto error;
        }
    }

    if (component2 > (UINT_MAX - (component1 * 40))) {
        ret = MBEDTLS_ERR_ASN1_INVALID_DATA;
        goto error;
    }
    ret = oid_subidentifier_encode_into(&out_ptr, out_bound,
                                        (component1 * 40) + component2);
    if (ret != 0) {
        goto error;
    }

    while (str_ptr < str_bound) {
        ret = oid_parse_number(&val, &str_ptr, str_bound);
        if (ret != 0) {
            goto error;
        }
        if (str_ptr < str_bound) {
            if (*str_ptr == '.') {
                str_ptr++;
            } else {
                ret = MBEDTLS_ERR_ASN1_INVALID_DATA;
                goto error;
            }
        }

        ret = oid_subidentifier_encode_into(&out_ptr, out_bound, val);
        if (ret != 0) {
            goto error;
        }
    }

    encoded_len = (size_t) (out_ptr - oid->p);
    resized_mem = (unsigned char*) mbedtls_calloc(encoded_len, 1);
    if (resized_mem == NULL) {
        ret = MBEDTLS_ERR_ASN1_ALLOC_FAILED;
        goto error;
    }
    memcpy(resized_mem, oid->p, encoded_len);
    mbedtls_free(oid->p);
    oid->p = resized_mem;
    oid->len = encoded_len;

    oid->tag = MBEDTLS_ASN1_OID;

    return 0;

error:
    mbedtls_free(oid->p);
    oid->p = NULL;
    oid->len = 0;
    return ret;
}